

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O0

void __thiscall Sector::set_baddatacrc(Sector *this,bool bad)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  iterator __first;
  iterator __last;
  value_type local_9c;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  const_iterator local_70;
  allocator<unsigned_char> local_61;
  undefined1 local_60 [8];
  Data pad;
  allocator<unsigned_char> local_31;
  Data local_30;
  value_type local_12;
  undefined1 local_11;
  uint8_t fill_byte;
  Sector *pSStack_10;
  bool bad_local;
  Sector *this_local;
  
  this->m_bad_data_crc = bad;
  if (!bad) {
    if (opt.fill < 0) {
      local_9c = '\0';
    }
    else {
      local_9c = (value_type)opt.fill;
    }
    local_12 = local_9c;
    local_11 = bad;
    pSStack_10 = this;
    bVar1 = has_data(this);
    if (bVar1) {
      iVar2 = copies(this);
      if (1 < iVar2) {
        std::vector<Data,_std::allocator<Data>_>::resize(&this->m_data,1);
        iVar2 = data_size(this);
        iVar3 = size(this);
        if (iVar2 < iVar3) {
          iVar2 = size(this);
          iVar3 = data_size(this);
          std::allocator<unsigned_char>::allocator(&local_61);
          Data::vector((Data *)local_60,(long)(iVar2 - iVar3),&local_12,&local_61);
          std::allocator<unsigned_char>::~allocator(&local_61);
          this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                    std::vector<Data,_std::allocator<Data>_>::operator[](&this->m_data,0);
          this_01 = &std::vector<Data,_std::allocator<Data>_>::operator[](&this->m_data,0)->
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
          local_78._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_01);
          __gnu_cxx::
          __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::__normal_iterator<unsigned_char*>
                    ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)&local_70,&local_78);
          __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
          __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    (this_00,local_70,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )__first._M_current,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )__last._M_current);
          Data::~Data((Data *)local_60);
        }
      }
    }
    else {
      iVar2 = size(this);
      std::allocator<unsigned_char>::allocator(&local_31);
      Data::vector(&local_30,(long)iVar2,&local_12,&local_31);
      std::vector<Data,_std::allocator<Data>_>::push_back(&this->m_data,&local_30);
      Data::~Data(&local_30);
      std::allocator<unsigned_char>::~allocator(&local_31);
    }
  }
  return;
}

Assistant:

void Sector::set_baddatacrc(bool bad)
{
    m_bad_data_crc = bad;

    if (!bad)
    {
        auto fill_byte = static_cast<uint8_t>((opt.fill >= 0) ? opt.fill : 0);

        if (!has_data())
            m_data.push_back(Data(size(), fill_byte));
        else if (copies() > 1)
        {
            m_data.resize(1);

            if (data_size() < size())
            {
                auto pad{ Data(size() - data_size(), fill_byte) };
                m_data[0].insert(m_data[0].begin(), pad.begin(), pad.end());
            }
        }
    }
}